

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

char * cmTargetPropertyComputer::GetSources<cmTarget>
                 (cmTarget *tgt,cmMessenger *messenger,cmListFileBacktrace *context)

{
  bool bVar1;
  MessageType t;
  bool bVar2;
  PolicyStatus PVar3;
  int iVar4;
  reference pbVar5;
  char *pcVar6;
  pointer pbVar7;
  ostream *poVar8;
  size_type sVar9;
  cmMakefile *this;
  cmSourceFile *this_00;
  string *psVar10;
  ulong uVar11;
  PolicyID id;
  string local_460 [32];
  string local_440 [8];
  string sname;
  cmSourceFileLocation *location;
  cmSourceFile *sf;
  string local_3f0;
  cmStateSnapshot local_3d0;
  MessageType local_3b4;
  undefined1 local_3b0 [4];
  MessageType messageType;
  ostringstream e;
  undefined1 local_230 [2];
  bool noMessage;
  bool addContent;
  string objLibName;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_208;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_200;
  const_iterator li;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string *entry;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c0;
  const_iterator i;
  char *sep;
  ostringstream ss;
  undefined1 local_38 [8];
  cmStringRange entries;
  cmListFileBacktrace *context_local;
  cmMessenger *messenger_local;
  cmTarget *tgt_local;
  
  entries.End._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)context;
  _local_38 = cmTarget::GetSourceEntries_abi_cxx11_(tgt);
  bVar2 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::empty((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)local_38);
  if (bVar2) {
    tgt_local = (cmTarget *)0x0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&sep);
    i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa6057c;
    local_1c0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)local_38);
    while( true ) {
      entry = (string *)
              cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)local_38);
      bVar2 = __gnu_cxx::operator!=
                        (&local_1c0,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&entry);
      if (!bVar2) break;
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_1c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&li);
      cmSystemTools::ExpandListArgument
                (pbVar5,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&li,false);
      local_208._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&li);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_200,&local_208);
      while( true ) {
        objLibName.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&li);
        bVar2 = __gnu_cxx::operator!=
                          (&local_200,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&objLibName.field_2 + 8));
        if (!bVar2) break;
        pbVar5 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_200);
        bVar2 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                          (pbVar5,(char (*) [18])"$<TARGET_OBJECTS:");
        if (bVar2) {
          pbVar5 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_200);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_200);
          std::__cxx11::string::size();
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)pbVar5);
          if (*pcVar6 != '>') goto LAB_00589184;
          pbVar7 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator->(&local_200);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_200);
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_230,(ulong)pbVar7);
          sVar9 = cmGeneratorExpression::Find((string *)local_230);
          if (sVar9 == 0xffffffffffffffff) {
            bVar1 = false;
            bVar2 = true;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
            local_3b4 = AUTHOR_WARNING;
            cmListFileBacktrace::GetBottom(&local_3d0,(cmListFileBacktrace *)entries.End._M_current)
            ;
            PVar3 = cmStateSnapshot::GetPolicy(&local_3d0,CMP0051);
            if (PVar3 != OLD) {
              if (PVar3 == WARN) {
                cmPolicies::GetPolicyWarning_abi_cxx11_(&local_3f0,(cmPolicies *)0x33,id);
                poVar8 = std::operator<<((ostream *)local_3b0,(string *)&local_3f0);
                std::operator<<(poVar8,"\n");
                std::__cxx11::string::~string((string *)&local_3f0);
                bVar2 = false;
              }
              else if (PVar3 - NEW < 3) {
                bVar1 = true;
              }
            }
            if (!bVar2) {
              poVar8 = std::operator<<((ostream *)local_3b0,"Target \"");
              psVar10 = cmTarget::GetName_abi_cxx11_(tgt);
              poVar8 = std::operator<<(poVar8,(string *)psVar10);
              std::operator<<(poVar8,
                              "\" contains $<TARGET_OBJECTS> generator expression in its sources list.  This content was not previously part of the SOURCES property when that property was read at configure time.  Code reading that property needs to be adapted to ignore the generator expression using the string(GENEX_STRIP) command."
                             );
              t = local_3b4;
              std::__cxx11::ostringstream::str();
              cmMessenger::IssueMessage
                        (messenger,t,(string *)&sf,(cmListFileBacktrace *)entries.End._M_current);
              std::__cxx11::string::~string((string *)&sf);
            }
            if (bVar1) {
              std::operator<<((ostream *)&sep,(char *)i._M_current);
              i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0xa32383;
              pbVar5 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_200);
              std::operator<<((ostream *)&sep,(string *)pbVar5);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
          }
          else {
            std::operator<<((ostream *)&sep,(char *)i._M_current);
            i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0xa32383;
            pbVar5 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_200);
            std::operator<<((ostream *)&sep,(string *)pbVar5);
          }
          std::__cxx11::string::~string((string *)local_230);
        }
        else {
LAB_00589184:
          pbVar5 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_200);
          sVar9 = cmGeneratorExpression::Find(pbVar5);
          if (sVar9 == 0xffffffffffffffff) {
            std::operator<<((ostream *)&sep,(char *)i._M_current);
            i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0xa32383;
            pbVar5 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_200);
            std::operator<<((ostream *)&sep,(string *)pbVar5);
          }
          else {
            this = cmTarget::GetMakefile(tgt);
            pbVar5 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_200);
            this_00 = cmMakefile::GetOrCreateSource(this,pbVar5,false);
            sname.field_2._8_8_ = cmSourceFile::GetLocation(this_00);
            psVar10 = cmSourceFileLocation::GetDirectory_abi_cxx11_
                                ((cmSourceFileLocation *)sname.field_2._8_8_);
            std::__cxx11::string::string(local_440,(string *)psVar10);
            uVar11 = std::__cxx11::string::empty();
            if ((uVar11 & 1) == 0) {
              std::__cxx11::string::operator+=(local_440,"/");
            }
            psVar10 = cmSourceFileLocation::GetName_abi_cxx11_
                                ((cmSourceFileLocation *)sname.field_2._8_8_);
            std::__cxx11::string::operator+=(local_440,(string *)psVar10);
            std::operator<<((ostream *)&sep,(char *)i._M_current);
            i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0xa32383;
            std::operator<<((ostream *)&sep,local_440);
            std::__cxx11::string::~string(local_440);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_200);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&li);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1c0);
    }
    if ((GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
         srcs_abi_cxx11_ == '\0') &&
       (iVar4 = __cxa_guard_acquire(&GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)
                                     ::srcs_abi_cxx11_), iVar4 != 0)) {
      std::__cxx11::string::string
                ((string *)
                 &GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
                  srcs_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
                    srcs_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)
                           ::srcs_abi_cxx11_);
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=
              ((string *)
               &GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
                srcs_abi_cxx11_,local_460);
    std::__cxx11::string::~string(local_460);
    tgt_local = (cmTarget *)std::__cxx11::string::c_str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sep);
  }
  return (char *)tgt_local;
}

Assistant:

const char* cmTargetPropertyComputer::GetSources<cmTarget>(
  cmTarget const* tgt, cmMessenger* messenger,
  cmListFileBacktrace const& context)
{
  cmStringRange entries = tgt->GetSourceEntries();
  if (entries.empty()) {
    return CM_NULLPTR;
  }

  std::ostringstream ss;
  const char* sep = "";
  for (std::vector<std::string>::const_iterator i = entries.begin();
       i != entries.end(); ++i) {
    std::string const& entry = *i;

    std::vector<std::string> files;
    cmSystemTools::ExpandListArgument(entry, files);
    for (std::vector<std::string>::const_iterator li = files.begin();
         li != files.end(); ++li) {
      if (cmHasLiteralPrefix(*li, "$<TARGET_OBJECTS:") &&
          (*li)[li->size() - 1] == '>') {
        std::string objLibName = li->substr(17, li->size() - 18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos) {
          ss << sep;
          sep = ";";
          ss << *li;
          continue;
        }

        bool addContent = false;
        bool noMessage = true;
        std::ostringstream e;
        cmake::MessageType messageType = cmake::AUTHOR_WARNING;
        switch (context.GetBottom().GetPolicy(cmPolicies::CMP0051)) {
          case cmPolicies::WARN:
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0051) << "\n";
            noMessage = false;
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::NEW:
            addContent = true;
        }
        if (!noMessage) {
          e << "Target \"" << tgt->GetName()
            << "\" contains "
               "$<TARGET_OBJECTS> generator expression in its sources "
               "list.  "
               "This content was not previously part of the SOURCES "
               "property "
               "when that property was read at configure time.  Code "
               "reading "
               "that property needs to be adapted to ignore the generator "
               "expression using the string(GENEX_STRIP) command.";
          messenger->IssueMessage(messageType, e.str(), context);
        }
        if (addContent) {
          ss << sep;
          sep = ";";
          ss << *li;
        }
      } else if (cmGeneratorExpression::Find(*li) == std::string::npos) {
        ss << sep;
        sep = ";";
        ss << *li;
      } else {
        cmSourceFile* sf = tgt->GetMakefile()->GetOrCreateSource(*li);
        // Construct what is known about this source file location.
        cmSourceFileLocation const& location = sf->GetLocation();
        std::string sname = location.GetDirectory();
        if (!sname.empty()) {
          sname += "/";
        }
        sname += location.GetName();

        ss << sep;
        sep = ";";
        // Append this list entry.
        ss << sname;
      }
    }
  }
  static std::string srcs;
  srcs = ss.str();
  return srcs.c_str();
}